

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

bool __thiscall Map::Load(Map *this)

{
  _List_node_base **pp_Var1;
  short sVar2;
  World *pWVar3;
  pointer psVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  uchar index;
  byte bVar7;
  int iVar8;
  uint uVar9;
  EffectType EVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  TileSpec TVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  WarpSpec WVar19;
  int iVar20;
  mapped_type *pmVar21;
  FILE *__stream;
  size_t sVar22;
  Map_Tile *pMVar23;
  ENF_Data *pEVar24;
  NPC *this_01;
  EIF_Data *pEVar25;
  long lVar26;
  undefined8 uVar27;
  pointer psVar28;
  byte x;
  bool bVar29;
  char buf [12];
  uint local_10c;
  uint local_fc;
  uint local_f4;
  undefined1 local_d1;
  key_type local_d0;
  uint local_ac;
  vector<NPC_*,_std::allocator<NPC_*>_> *local_a8;
  Map_Chest chest;
  string filename;
  char namebuf [6];
  
  if (this->id < 0) {
    return false;
  }
  pWVar3 = this->world;
  pp_Var1 = &chest.items.super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
  chest._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&chest,"MapDir","");
  pmVar21 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)&chest);
  util::variant::GetString_abi_cxx11_(&filename,pmVar21);
  if ((_List_node_base **)chest._0_8_ != pp_Var1) {
    operator_delete((void *)chest._0_8_,
                    (ulong)((long)&(chest.items.
                                    super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  sprintf(namebuf,"%05i",(ulong)(uint)(int)this->id);
  std::__cxx11::string::append((char *)&filename);
  std::__cxx11::string::append((char *)&filename);
  map_safe_fail_filename = filename._M_dataplus._M_p;
  __stream = fopen(filename._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
LAB_00170b14:
    bVar29 = false;
    goto LAB_00171125;
  }
  this->has_timed_spikes = false;
  iVar8 = fseek(__stream,3,0);
  uVar27 = 0x1d1;
  if (iVar8 == 0) {
    sVar22 = fread(this->rid,1,4,__stream);
    uVar27 = 0x1d2;
    if (sVar22 == 4) {
      iVar8 = fseek(__stream,0x1f,0);
      uVar27 = 0x1d8;
      if (iVar8 == 0) {
        sVar22 = fread(buf,1,2,__stream);
        uVar27 = 0x1d9;
        if (sVar22 == 2) {
          uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
          this->pk = uVar9 == 3;
          EVar10 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
          this->effect = EVar10;
          iVar8 = fseek(__stream,0x25,0);
          uVar27 = 0x1dd;
          if (iVar8 == 0) {
            sVar22 = fread(buf,1,2,__stream);
            uVar27 = 0x1de;
            if (sVar22 == 2) {
              uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
              this->width = (char)uVar9 + '\x01';
              uVar9 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
              bVar7 = (char)uVar9 + 1;
              this->height = bVar7;
              std::vector<Map_Tile,_std::allocator<Map_Tile>_>::resize
                        (&this->tiles,(ulong)this->width * (ulong)bVar7);
              iVar8 = fseek(__stream,0x2a,0);
              uVar27 = 0x1e4;
              if (iVar8 == 0) {
                sVar22 = fread(buf,1,3,__stream);
                uVar27 = 0x1e5;
                if (sVar22 == 3) {
                  uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                  this->scroll = uVar9 != 0;
                  uVar9 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                  this->relog_x = (uchar)uVar9;
                  uVar9 = PacketProcessor::Number(buf[2],0xfe,0xfe,0xfe);
                  this->relog_y = (uchar)uVar9;
                  iVar8 = fseek(__stream,0x2e,0);
                  uVar27 = 0x1ea;
                  if (iVar8 == 0) {
                    sVar22 = fread(buf,1,1,__stream);
                    uVar27 = 0x1eb;
                    if (sVar22 == 1) {
                      uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                      if ((char)uVar9 != '\0') {
                        iVar8 = fseek(__stream,(ulong)((uVar9 & 0xff) << 3),1);
                        uVar27 = 0x1ef;
                        if (iVar8 != 0) goto LAB_00171104;
                      }
                      sVar22 = fread(buf,1,1,__stream);
                      uVar27 = 0x1f2;
                      if (sVar22 == 1) {
                        uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                        if ((char)uVar9 != '\0') {
                          iVar8 = fseek(__stream,(ulong)((uVar9 & 0xff) << 2),1);
                          uVar27 = 0x1f6;
                          if (iVar8 != 0) goto LAB_00171104;
                        }
                        sVar22 = fread(buf,1,1,__stream);
                        uVar27 = 0x1f9;
                        if (sVar22 == 1) {
                          uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                          if ((uVar9 & 0xff) != 0) {
                            iVar8 = fseek(__stream,(ulong)((uVar9 & 0xff) * 0xc),1);
                            uVar27 = 0x1fd;
                            if (iVar8 != 0) goto LAB_00171104;
                          }
                          sVar22 = fread(buf,1,1,__stream);
                          uVar27 = 0x200;
                          if (sVar22 == 1) {
                            uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                            if ((uVar9 & 0xff) != 0) {
                              local_10c = 0;
                              do {
                                sVar22 = fread(buf,1,2,__stream);
                                if (sVar22 != 2) {
                                  fclose(__stream);
                                  bVar29 = false;
                                  Console::Err("Invalid file / failed read/seek: %s -- %i",
                                               map_safe_fail_filename,0x204);
                                  goto LAB_00171125;
                                }
                                uVar11 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                uVar12 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                uVar12 = uVar12 & 0xff;
                                if (uVar12 != 0) {
                                  bVar7 = (byte)uVar11;
                                  do {
                                    sVar22 = fread(buf,1,2,__stream);
                                    if (sVar22 != 2) {
                                      fclose(__stream);
                                      bVar29 = false;
                                      Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                   map_safe_fail_filename,0x209);
                                      goto LAB_00171125;
                                    }
                                    uVar13 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                    TVar14 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                    x = (byte)uVar13;
                                    if ((x < this->width) && (bVar7 < this->height)) {
                                      pMVar23 = GetTile(this,x,bVar7);
                                      pMVar23->tilespec = TVar14 & 0xff;
                                      if ((char)TVar14 == '\"') {
LAB_0017078c:
                                        this->has_timed_spikes = true;
                                      }
                                      else if ((TVar14 & 0xff) == Chest) {
                                        chest.items.
                                        super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                        ._M_impl._M_node.super__List_node_base._M_next =
                                             (_List_node_base *)&chest.items;
                                        chest.items.
                                        super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                        ._M_impl._M_node._M_size = 0;
                                        chest.spawns.
                                        super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                        ._M_impl._M_node.super__List_node_base._M_next =
                                             (_List_node_base *)&chest.spawns;
                                        chest.spawns.
                                        super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                        ._M_impl._M_node._M_size = 0;
                                        pWVar3 = this->world;
                                        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                                        chest.items.
                                        super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev =
                                             chest.items.
                                             super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                             ._M_impl._M_node.super__List_node_base._M_next;
                                        chest.spawns.
                                        super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev =
                                             chest.spawns.
                                             super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                             ._M_impl._M_node.super__List_node_base._M_next;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_d0,"MaxChest","");
                                        pmVar21 = std::__detail::
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar3->config,&local_d0);
                                        chest.maxchest = util::variant::GetInt(pmVar21);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                                          operator_delete(local_d0._M_dataplus._M_p,
                                                          local_d0.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        pWVar3 = this->world;
                                        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_d0,"ChestSlots","");
                                        pmVar21 = std::__detail::
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar3->config,&local_d0);
                                        chest.chestslots = util::variant::GetInt(pmVar21);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                                          operator_delete(local_d0._M_dataplus._M_p,
                                                          local_d0.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        chest.y = bVar7;
                                        chest.x = x;
                                        chest.slots = 0;
                                        local_d0._M_dataplus._M_p = (pointer)0x0;
                                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                        __shared_count<Map_Chest,std::allocator<Map_Chest>,Map_Chest&>
                                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                   &local_d0._M_string_length,
                                                   (Map_Chest **)&local_d0,
                                                   (allocator<Map_Chest> *)&local_d1,&chest);
                                        std::
                                        vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                        ::emplace_back<std::shared_ptr<Map_Chest>>
                                                  ((
                                                  vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                  *)&this->chests,(shared_ptr<Map_Chest> *)&local_d0
                                                  );
                                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            local_d0._M_string_length !=
                                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                          _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )local_d0._M_string_length);
                                        }
                                        Map_Chest::~Map_Chest(&chest);
                                        if ((TVar14 & 0xff) == Spikes1) goto LAB_0017078c;
                                      }
                                    }
                                    else {
                                      Console::Wrn(
                                                  "Tile spec on map %i is outside of map bounds (%ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)(uVar13 & 0xff)
                                                  ,(ulong)(uVar11 & 0xff));
                                    }
                                    uVar12 = uVar12 - 1;
                                  } while (uVar12 != 0);
                                }
                                local_10c = local_10c + 1;
                              } while (local_10c != (uVar9 & 0xff));
                            }
                            sVar22 = fread(buf,1,1,__stream);
                            uVar27 = 0x227;
                            if (sVar22 == 1) {
                              uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                              uVar9 = uVar9 & 0xff;
                              bVar29 = uVar9 != 0;
                              if (bVar29) {
                                local_fc = 0;
                                do {
                                  sVar22 = fread(buf,1,2,__stream);
                                  if (sVar22 != 2) {
                                    fclose(__stream);
                                    Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                 map_safe_fail_filename,0x22b);
LAB_00170b0d:
                                    if (bVar29) goto LAB_00170b14;
                                    break;
                                  }
                                  uVar12 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                  uVar11 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                  for (uVar11 = uVar11 & 0xff; uVar11 != 0; uVar11 = uVar11 - 1) {
                                    sVar22 = fread(buf,1,8,__stream);
                                    if (sVar22 == 8) {
                                      uVar13 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                      uVar15 = PacketProcessor::Number(buf[1],buf[2],0xfe,0xfe);
                                      uVar16 = PacketProcessor::Number(buf[3],0xfe,0xfe,0xfe);
                                      uVar17 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
                                      uVar18 = PacketProcessor::Number(buf[5],0xfe,0xfe,0xfe);
                                      WVar19 = PacketProcessor::Number(buf[6],buf[7],0xfe,0xfe);
                                      if (((byte)uVar13 < this->width) &&
                                         ((byte)uVar12 < this->height)) {
                                        pMVar23 = GetTile(this,(byte)uVar13,(byte)uVar12);
                                        (pMVar23->warp).map = (short)uVar15;
                                        (pMVar23->warp).x = (uchar)uVar16;
                                        (pMVar23->warp).y = (uchar)uVar17;
                                        (pMVar23->warp).levelreq = (uchar)uVar18;
                                        (pMVar23->warp).spec = WVar19;
                                        (pMVar23->warp).open = false;
                                        iVar8 = 0;
                                      }
                                      else {
                                        iVar8 = 0xd;
                                        Console::Wrn(
                                                  "Warp on map %i is outside of map bounds (%ix%i)",
                                                  (ulong)(uint)(int)this->id,(ulong)(uVar13 & 0xff),
                                                  (ulong)uVar12 & 0xff);
                                      }
                                    }
                                    else {
                                      fclose(__stream);
                                      iVar8 = 1;
                                      Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                   map_safe_fail_filename,0x231);
                                    }
                                    if ((iVar8 != 0xd) && (iVar8 != 0)) goto LAB_00170a41;
                                  }
                                  iVar8 = 0xb;
LAB_00170a41:
                                  if ((iVar8 != 0xb) && (iVar8 != 0)) goto LAB_00170b0d;
                                  local_fc = local_fc + 1;
                                  bVar29 = local_fc < uVar9;
                                } while (local_fc != uVar9);
                              }
                              iVar8 = fseek(__stream,0x2e,0);
                              uVar27 = 0x24c;
                              if (iVar8 == 0) {
                                sVar22 = fread(buf,1,1,__stream);
                                uVar27 = 0x24d;
                                if (sVar22 == 1) {
                                  local_ac = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                  local_ac = local_ac & 0xff;
                                  if (local_ac != 0) {
                                    local_a8 = &this->npcs;
                                    index = '\0';
                                    local_f4 = 0;
                                    do {
                                      sVar22 = fread(buf,1,8,__stream);
                                      if (sVar22 != 8) {
                                        fclose(__stream);
                                        bVar29 = false;
                                        Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                     map_safe_fail_filename,0x252);
                                        goto LAB_00171125;
                                      }
                                      uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                      uVar11 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                      uVar12 = PacketProcessor::Number(buf[2],buf[3],0xfe,0xfe);
                                      uVar13 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
                                      uVar15 = PacketProcessor::Number(buf[5],buf[6],0xfe,0xfe);
                                      uVar16 = PacketProcessor::Number(buf[7],0xfe,0xfe,0xfe);
                                      local_10c._0_2_ = (short)uVar12;
                                      uVar12 = (uint)(short)local_10c;
                                      pEVar24 = ENF::Get(this->world->enf,uVar12);
                                      if (pEVar24->id == 0) {
                                        Console::Wrn(
                                                  "An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)uVar12,
                                                  (ulong)(uVar9 & 0xff),(ulong)(uVar11 & 0xff));
                                      }
                                      uVar16 = uVar16 & 0xff;
                                      if (uVar16 != 0) {
                                        do {
                                          if (((byte)uVar9 < this->width) &&
                                             ((byte)uVar11 < this->height)) {
                                            this_01 = (NPC *)operator_new(0x70);
                                            NPC::NPC(this_01,this,(short)local_10c,(byte)uVar9,
                                                     (byte)uVar11,(uchar)uVar13,(short)uVar15,index,
                                                     false);
                                            chest._0_8_ = this_01;
                                            std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                                                      (local_a8,(value_type *)&chest);
                                            NPC::Spawn((NPC *)chest._0_8_,(NPC *)0x0);
                                            index = index + '\x01';
                                          }
                                          else {
                                            sVar2 = this->id;
                                            pEVar24 = ENF::Get(this->world->enf,uVar12);
                                            Console::Wrn(
                                                  "An NPC spawn on map %i is outside of map bounds (%s at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar2,
                                                  (pEVar24->name)._M_dataplus._M_p,
                                                  (ulong)uVar9 & 0xff,(ulong)uVar11 & 0xff);
                                          }
                                          uVar16 = uVar16 - 1;
                                        } while (uVar16 != 0);
                                      }
                                      local_f4 = local_f4 + 1;
                                    } while (local_f4 != local_ac);
                                  }
                                  sVar22 = fread(buf,1,1,__stream);
                                  uVar27 = 0x26e;
                                  if (sVar22 == 1) {
                                    uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                    if ((char)uVar9 != '\0') {
                                      iVar8 = fseek(__stream,(ulong)((uVar9 & 0xff) << 2),1);
                                      uVar27 = 0x272;
                                      if (iVar8 != 0) goto LAB_001710e1;
                                    }
                                    sVar22 = fread(buf,1,1,__stream);
                                    uVar27 = 0x275;
                                    if (sVar22 == 1) {
                                      uVar9 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                      if ((uVar9 & 0xff) != 0) {
                                        local_a8 = (vector<NPC_*,_std::allocator<NPC_*>_> *)
                                                   ((ulong)local_a8 & 0xffffffff00000000);
                                        do {
                                          sVar22 = fread(buf,1,0xc,__stream);
                                          if (sVar22 != 0xc) {
                                            fclose(__stream);
                                            bVar29 = false;
                                            Console::Err("Invalid file / failed read/seek: %s -- %i"
                                                         ,map_safe_fail_filename,0x279);
                                            goto LAB_00171125;
                                          }
                                          uVar11 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                          uVar12 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                          uVar13 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
                                          uVar15 = PacketProcessor::Number(buf[5],buf[6],0xfe,0xfe);
                                          uVar16 = PacketProcessor::Number(buf[7],buf[8],0xfe,0xfe);
                                          uVar17 = PacketProcessor::Number
                                                             (buf[9],buf[10],buf[0xb],0xfe);
                                          local_10c._0_2_ = (short)uVar15;
                                          uVar15 = (uint)(short)local_10c;
                                          pEVar25 = EIF::Get(this->world->eif,uVar15);
                                          if (uVar15 != pEVar25->id) {
                                            Console::Wrn(
                                                  "A chest spawn on map %i uses a non-existent item (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)uVar15,
                                                  (ulong)(uVar11 & 0xff),(ulong)(uVar12 & 0xff));
                                          }
                                          psVar28 = (this->chests).
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                          psVar4 = (this->chests).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                          bVar29 = psVar28 == psVar4;
                                          if (!bVar29) {
                                            iVar8 = (short)uVar13 + 1;
                                            do {
                                              peVar5 = (psVar28->
                                                                                                              
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr;
                                              this_00 = (psVar28->
                                                                                                                
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_refcount._M_pi;
                                              if (this_00 !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                if (__libc_single_threaded == '\0') {
                                                  LOCK();
                                                  this_00->_M_use_count = this_00->_M_use_count + 1;
                                                  UNLOCK();
                                                }
                                                else {
                                                  this_00->_M_use_count = this_00->_M_use_count + 1;
                                                }
                                              }
                                              bVar6 = true;
                                              if ((peVar5->x == (uchar)uVar11) &&
                                                 (peVar5->y == (uchar)uVar12)) {
                                                chest.items.
                                                super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                ._M_impl._M_node.super__List_node_base._M_prev._0_6_
                                                     = CONCAT24((short)uVar16,iVar8);
                                                chest.items.
                                                super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                ._M_impl._M_node._M_size = (size_t)Timer::GetTime();
                                                chest._4_2_ = (short)local_10c;
                                                chest.items.
                                                super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                ._M_impl._M_node.super__List_node_base._M_next =
                                                     (_List_node_base *)
                                                     CONCAT44(chest.items.
                                                                                                                            
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next.
                                                  _4_4_,uVar17);
                                                std::__cxx11::
                                                list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                                ::push_back(&peVar5->spawns,(value_type *)&chest);
                                                iVar20 = peVar5->slots;
                                                if (peVar5->slots <= iVar8) {
                                                  iVar20 = iVar8;
                                                }
                                                peVar5->slots = iVar20;
                                                bVar6 = false;
                                              }
                                              if (this_00 !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release(this_00);
                                              }
                                              if (!bVar6) {
                                                if (!bVar29) goto LAB_001710b1;
                                                break;
                                              }
                                              psVar28 = psVar28 + 1;
                                              bVar29 = psVar28 == psVar4;
                                            } while (!bVar29);
                                          }
                                          sVar2 = this->id;
                                          pEVar25 = EIF::Get(this->world->eif,uVar15);
                                          Console::Wrn(
                                                  "A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar2,
                                                  (pEVar25->name)._M_dataplus._M_p,(ulong)uVar17,
                                                  (ulong)(uVar11 & 0xff),(ulong)(uVar12 & 0xff));
LAB_001710b1:
                                          uVar11 = (int)local_a8 + 1;
                                          local_a8 = (vector<NPC_*,_std::allocator<NPC_*>_> *)
                                                     CONCAT44(local_a8._4_4_,uVar11);
                                        } while (uVar11 != (uVar9 & 0xff));
                                      }
                                      iVar8 = fseek(__stream,0,2);
                                      uVar27 = 0x29c;
                                      if (iVar8 == 0) {
                                        lVar26 = ftell(__stream);
                                        this->filesize = (int)lVar26;
                                        fclose(__stream);
                                        this->exists = true;
                                        bVar29 = true;
                                        goto LAB_00171125;
                                      }
                                    }
                                  }
LAB_001710e1:
                                  fclose(__stream);
                                  bVar29 = false;
                                  Console::Err("Invalid file / failed read/seek: %s -- %i",
                                               map_safe_fail_filename,uVar27);
                                  goto LAB_00171125;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00171104:
      fclose(__stream);
      bVar29 = false;
      Console::Err("Invalid file / failed read/seek: %s -- %i",map_safe_fail_filename,uVar27);
      goto LAB_00171125;
    }
  }
  fclose(__stream);
  bVar29 = false;
  Console::Err("Invalid file / failed read/seek: %s -- %i",map_safe_fail_filename,uVar27);
LAB_00171125:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return bVar29;
}

Assistant:

bool Map::Load()
{
	char namebuf[6];

	if (this->id < 0)
	{
		return false;
	}

	std::string filename = this->world->config["MapDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename.append(namebuf);
	filename.append(".emf");

	map_safe_fail_filename = filename.c_str();

	std::FILE *fh = std::fopen(filename.c_str(), "rb");

	if (!fh)
		return false;

	this->has_timed_spikes = false;

	SAFE_SEEK(fh, 0x03, SEEK_SET);
	SAFE_READ(this->rid, sizeof(char), 4, fh);

	char buf[12];
	unsigned char outersize;
	unsigned char innersize;

	SAFE_SEEK(fh, 0x1F, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->pk = PacketProcessor::Number(buf[0]) == 3;
	this->effect = static_cast<EffectType>(PacketProcessor::Number(buf[1]));

	SAFE_SEEK(fh, 0x25, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->width = PacketProcessor::Number(buf[0]) + 1;
	this->height = PacketProcessor::Number(buf[1]) + 1;

	this->tiles.resize(this->height * this->width);

	SAFE_SEEK(fh, 0x2A, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 3, fh);
	this->scroll = PacketProcessor::Number(buf[0]);
	this->relog_x = PacketProcessor::Number(buf[1]);
	this->relog_y = PacketProcessor::Number(buf[2]);

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 8 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 12 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			SAFE_READ(buf, sizeof(char), 2, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			unsigned char spec = PacketProcessor::Number(buf[1]);

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Tile spec on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			this->GetTile(xloc, yloc).tilespec = static_cast<Map_Tile::TileSpec>(spec);

			if (spec == Map_Tile::Chest)
			{
				Map_Chest chest;
				chest.maxchest = static_cast<int>(this->world->config["MaxChest"]);
				chest.chestslots = static_cast<int>(this->world->config["ChestSlots"]);
				chest.x = xloc;
				chest.y = yloc;
				chest.slots = 0;
				this->chests.push_back(std::make_shared<Map_Chest>(chest));
			}

			if (spec == Map_Tile::Spikes1)
			{
				this->has_timed_spikes = true;
			}
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			Map_Warp newwarp;
			SAFE_READ(buf, sizeof(char), 8, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			newwarp.map = PacketProcessor::Number(buf[1], buf[2]);
			newwarp.x = PacketProcessor::Number(buf[3]);
			newwarp.y = PacketProcessor::Number(buf[4]);
			newwarp.levelreq = PacketProcessor::Number(buf[5]);
			newwarp.spec = static_cast<Map_Warp::WarpSpec>(PacketProcessor::Number(buf[6], buf[7]));

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Warp on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			try
			{
				this->GetTile(xloc, yloc).warp = newwarp;
			}
			catch (...)
			{
				std::fclose(fh);
				map_safe_fail(__LINE__);
				return false;
			}
		}
	}

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	int index = 0;
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 8, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short npc_id = PacketProcessor::Number(buf[2], buf[3]);
		unsigned char spawntype = PacketProcessor::Number(buf[4]);
		short spawntime = PacketProcessor::Number(buf[5], buf[6]);
		unsigned char amount = PacketProcessor::Number(buf[7]);

		if (!this->world->enf->Get(npc_id))
		{
			Console::Wrn("An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)", this->id, npc_id, x, y);
		}

		for (int ii = 0; ii < amount; ++ii)
		{
			if (!this->InBounds(x, y))
			{
				Console::Wrn("An NPC spawn on map %i is outside of map bounds (%s at %ix%i)", this->id, this->world->enf->Get(npc_id).name.c_str(), x, y);
				continue;
			}

			NPC *newnpc = new NPC(this, npc_id, x, y, spawntype, spawntime, index++);
			this->npcs.push_back(newnpc);

			newnpc->Spawn();
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 12, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short slot = PacketProcessor::Number(buf[4]);
		short itemid = PacketProcessor::Number(buf[5], buf[6]);
		short time = PacketProcessor::Number(buf[7], buf[8]);
		int amount = PacketProcessor::Number(buf[9], buf[10], buf[11]);

		if (itemid != this->world->eif->Get(itemid).id)
		{
			Console::Wrn("A chest spawn on map %i uses a non-existent item (#%i at %ix%i)", this->id, itemid, x, y);
		}

		UTIL_FOREACH(this->chests, chest)
		{
			if (chest->x == x && chest->y == y)
			{
				Map_Chest_Spawn spawn;

				spawn.slot = slot+1;
				spawn.time = time;
				spawn.last_taken = Timer::GetTime();
				spawn.item.id = itemid;
				spawn.item.amount = amount;

				chest->spawns.push_back(spawn);
				chest->slots = std::max(chest->slots, slot+1);
				goto skip_warning;
			}
		}
		Console::Wrn("A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)", this->id, this->world->eif->Get(itemid).name.c_str(), amount, x, y);
		skip_warning:
		;
	}

	SAFE_SEEK(fh, 0x00, SEEK_END);
	this->filesize = std::ftell(fh);

	std::fclose(fh);

	this->exists = true;

	return true;
}